

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gui.cpp
# Opt level: O2

void __thiscall nivalis::Plotter::handle_mouse_move(Plotter *this,int px,int py)

{
  pointer pPVar1;
  int iVar2;
  pointer pPVar3;
  pointer puVar4;
  double dVar5;
  double dVar6;
  uint64_t uVar7;
  uint uVar8;
  ulong uVar9;
  int iVar10;
  int iVar11;
  double dVar12;
  undefined1 auVar13 [16];
  double dVar14;
  undefined1 auVar15 [16];
  undefined1 auVar17 [16];
  float fVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  double dVar21;
  undefined1 auVar16 [16];
  
  uVar9 = (ulong)this->drag_marker;
  if ((uVar9 == 0xffffffffffffffff) ||
     (pPVar3 = (this->pt_markers).
               super__Vector_base<nivalis::PointMarker,_std::allocator<nivalis::PointMarker>_>.
               _M_impl.super__Vector_impl_data._M_start,
     (ulong)(((long)(this->pt_markers).
                    super__Vector_base<nivalis::PointMarker,_std::allocator<nivalis::PointMarker>_>.
                    _M_impl.super__Vector_impl_data._M_finish - (long)pPVar3) / 0x38) <= uVar9)) {
LAB_00126bf4:
    if (this->drag_view != true) {
      if (-1 < (py | px)) {
        uVar9 = (ulong)((this->view).swid * py + px);
        puVar4 = (this->grid).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        if ((uVar9 < (ulong)((long)(this->grid).
                                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)puVar4 >> 3))
           && (puVar4[uVar9] != 0xffffffffffffffff)) {
          detect_marker_click(this,px,py,(bool)(this->drag_trace ^ 1),false);
          return;
        }
      }
      (this->marker_text)._M_string_length = 0;
      *(this->marker_text)._M_dataplus._M_p = '\0';
      return;
    }
    iVar10 = this->dragx;
    iVar2 = this->dragy;
    this->dragx = px;
    this->dragy = py;
    dVar14 = (this->view).xmax;
    dVar12 = (this->view).xmin;
    dVar5 = (this->view).ymax;
    dVar6 = (this->view).ymin;
    dVar21 = ((dVar14 - dVar12) / (double)(this->view).swid) * (double)(px - iVar10);
    (this->view).xmax = dVar14 - dVar21;
    (this->view).xmin = dVar12 - dVar21;
    dVar14 = ((dVar5 - dVar6) / (double)(this->view).shigh) * (double)(py - iVar2);
    (this->view).ymax = dVar14 + dVar5;
    (this->view).ymin = dVar14 + dVar6;
    goto LAB_00126d34;
  }
  pPVar1 = pPVar3 + uVar9;
  if (pPVar3[uVar9].drag_var_x == 0xffffffffffffffff) {
    uVar7 = pPVar1->drag_var_y;
    if (uVar7 == 0xffffffffffffffff) goto LAB_00126bf4;
LAB_00126b36:
    iVar10 = (this->view).shigh;
    dVar14 = (this->view).ymin;
    dVar12 = (double)iVar10;
    (this->env).vars.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start[uVar7] =
         (((this->view).ymax - dVar14) * (double)(iVar10 - py)) / dVar12 + dVar14;
  }
  else {
    dVar14 = (this->view).xmin;
    (this->env).vars.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start[pPVar3[uVar9].drag_var_x] =
         (((this->view).xmax - dVar14) * (double)px) / (double)(this->view).swid + dVar14;
    uVar7 = pPVar1->drag_var_y;
    if (uVar7 != 0xffffffffffffffff) goto LAB_00126b36;
    iVar10 = (this->view).shigh;
    dVar12 = (double)iVar10;
  }
  iVar2 = (this->view).swid;
  dVar5 = (this->view).ymax;
  dVar14 = (this->view).xmin;
  auVar19._0_8_ = (dVar5 - pPVar1->y) * dVar12;
  auVar19._8_8_ = (pPVar1->x - dVar14) * (double)iVar2;
  auVar13._0_8_ = dVar5 - (this->view).ymin;
  auVar13._8_8_ = (this->view).xmax - dVar14;
  auVar20 = divpd(auVar19,auVar13);
  auVar15._0_4_ = (float)auVar20._0_8_;
  auVar15._4_4_ = (float)auVar20._8_8_;
  auVar15._8_8_ = 0;
  auVar13 = maxps(ZEXT816(0),auVar15);
  auVar20._0_4_ = (float)iVar10 + -1.0;
  auVar20._4_4_ = (float)iVar2 + -1.0;
  auVar20._8_8_ = 0;
  iVar10 = -(uint)(auVar20._0_4_ < auVar13._0_4_);
  iVar11 = -(uint)(auVar20._4_4_ < auVar13._4_4_);
  auVar17._4_4_ = iVar11;
  auVar17._0_4_ = iVar10;
  auVar17._8_4_ = iVar11;
  auVar17._12_4_ = iVar11;
  auVar16._8_8_ = auVar17._8_8_;
  auVar16._4_4_ = iVar10;
  auVar16._0_4_ = iVar10;
  uVar8 = movmskpd((int)pPVar1,auVar16);
  fVar18 = auVar20._4_4_;
  if ((uVar8 & 2) == 0) {
    fVar18 = auVar13._4_4_;
  }
  if ((uVar8 & 1) == 0) {
    auVar20 = auVar13;
  }
  iVar10 = (int)(auVar20._0_4_ + 0.5);
  if ((this->grid).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start[iVar2 * iVar10 + (int)(fVar18 + 0.5)] != 0xffffffffffffffff)
  {
    detect_marker_click(this,(int)(fVar18 + 0.5),iVar10,true,false);
  }
LAB_00126d34:
  this->require_update = true;
  return;
}

Assistant:

void Plotter::handle_mouse_move(int px, int py) {
    if (~drag_marker &&
        drag_marker < pt_markers.size() &&
            (~pt_markers[drag_marker].drag_var_x ||
             ~pt_markers[drag_marker].drag_var_y)) {
        // Draggable marker
        auto& ptm = pt_markers[drag_marker];
        if (~ptm.drag_var_x) {
            env.vars[ptm.drag_var_x] = _SX_TO_X(px);
        }
        if (~ptm.drag_var_y) {
            env.vars[ptm.drag_var_y] = _SY_TO_Y(py);
        }
        int sx = (int)(std::min(std::max(_X_TO_SX(ptm.x), 0.f), (float) view.swid - 1.f) + 0.5f);
        int sy = (int)(std::min(std::max(_Y_TO_SY(ptm.y), 0.f), (float) view.shigh - 1.f) + 0.5f);
        if (~grid[sy * view.swid + sx]) detect_marker_click(sx, sy, true, false);
        require_update = true;
        return;
    }
    if (drag_view) {
        // Dragging background
        int dx = px - dragx;
        int dy = py - dragy;
        dragx = px; dragy = py;
        double fx = (view.xmax - view.xmin) / view.swid * dx;
        double fy = (view.ymax - view.ymin) / view.shigh * dy;
        view.xmax -= fx; view.xmin -= fx;
        view.ymax += fy; view.ymin += fy;
        require_update = true;
    } else if (px >= 0 && py >= 0 &&
            py * view.swid + px < grid.size() &&
            ~grid[py * view.swid + px]) {
        // Trace drag mode
        // Show marker if point marker under cursor
        detect_marker_click(px, py, !drag_trace, false);
    } else {
        marker_text.clear();
    }
}